

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::AssignmentExpression::visitExprs<always_ff_assignment_outside_conditional::MainVisitor&>
          (AssignmentExpression *this,AlwaysFFVisitor *visitor)

{
  if (this->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<always_ff_assignment_outside_conditional::MainVisitor>
              (this->timingControl,visitor);
  }
  Expression::visit<always_ff_assignment_outside_conditional::MainVisitor&>(this->left_,visitor);
  Expression::visit<always_ff_assignment_outside_conditional::MainVisitor&>(this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }